

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvui.h
# Opt level: O1

void cvui::render::window
               (cvui_block_t *theBlock,Rect *theTitleBar,Rect *theContent,String *theTitle)

{
  undefined8 local_118;
  cvui_block_t *pcStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  int local_f0;
  int local_ec;
  int local_e8;
  int local_e4;
  int local_e0;
  int local_dc;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  Mat aOverlay;
  
  cv::Mat::Mat(&aOverlay);
  local_b8 = theTitleBar->x;
  local_b4 = theTitleBar->y;
  local_b0 = theTitleBar->width;
  local_ac = theTitleBar->height;
  local_118 = 0x4052800000000000;
  pcStack_110 = (cvui_block_t *)0x4052800000000000;
  local_108 = 0x4052800000000000;
  uStack_100 = 0;
  cv::rectangle();
  local_c8 = theTitleBar->x + 1;
  theTitleBar->x = local_c8;
  local_c4 = theTitleBar->y + 1;
  theTitleBar->y = local_c4;
  local_c0 = theTitleBar->width + -2;
  theTitleBar->width = local_c0;
  local_bc = theTitleBar->height + -2;
  theTitleBar->height = local_bc;
  local_118 = 0x4040800000000000;
  pcStack_110 = (cvui_block_t *)0x4040800000000000;
  local_108 = 0x4040800000000000;
  uStack_100 = 0;
  cv::rectangle();
  local_f0 = theTitleBar->x + 5;
  local_ec = theTitleBar->y + 0xc;
  local_108 = 0;
  local_118 = CONCAT44(local_118._4_4_,0x3010000);
  local_a8 = 0x4069c00000000000;
  uStack_a0 = 0x4069c00000000000;
  local_98 = 0x4069c00000000000;
  uStack_90 = 0;
  pcStack_110 = theBlock;
  cv::putText(0x9999999a,&local_118,theTitle,&local_f0,0,&local_a8,1,0x10,0);
  local_d8 = theContent->x;
  local_d4 = theContent->y;
  local_d0 = theContent->width;
  local_cc = theContent->height;
  local_118 = 0x4052800000000000;
  pcStack_110 = (cvui_block_t *)0x4052800000000000;
  local_108 = 0x4052800000000000;
  uStack_100 = 0;
  cv::rectangle();
  local_e8 = theContent->x + 1;
  theContent->x = local_e8;
  local_e4 = theContent->y + 1;
  theContent->y = local_e4;
  local_e0 = theContent->width + -2;
  theContent->width = local_e0;
  local_dc = theContent->height + -2;
  theContent->height = local_dc;
  local_118 = 0x4048800000000000;
  pcStack_110 = (cvui_block_t *)0x4048800000000000;
  local_108 = 0x4048800000000000;
  uStack_100 = 0;
  cv::rectangle();
  cv::Mat::~Mat(&aOverlay);
  return;
}

Assistant:

void window(cvui_block_t& theBlock, cv::Rect& theTitleBar, cv::Rect& theContent, const cv::String& theTitle) {
		bool aTransparecy = false;
		double aAlpha = 0.3;
		cv::Mat aOverlay;

		// Render the title bar.
		// First the border
		cv::rectangle(theBlock.where, theTitleBar, cv::Scalar(0x4A, 0x4A, 0x4A));
		// then the inside
		theTitleBar.x++; theTitleBar.y++; theTitleBar.width -= 2; theTitleBar.height -= 2;
		cv::rectangle(theBlock.where, theTitleBar, cv::Scalar(0x21, 0x21, 0x21), CVUI_FILLED);

		// Render title text.
		cv::Point aPos(theTitleBar.x + 5, theTitleBar.y + 12);
		cv::putText(theBlock.where, theTitle, aPos, cv::FONT_HERSHEY_SIMPLEX, 0.4, cv::Scalar(0xCE, 0xCE, 0xCE), 1, CVUI_ANTIALISED);

		// Render the body.
		// First the border.
		cv::rectangle(theBlock.where, theContent, cv::Scalar(0x4A, 0x4A, 0x4A));

		// Then the filling.
		theContent.x++; theContent.y++; theContent.width -= 2; theContent.height -= 2;

		if (aTransparecy) {
			theBlock.where.copyTo(aOverlay);
			cv::rectangle(aOverlay, theContent, cv::Scalar(0x31, 0x31, 0x31), CVUI_FILLED);
			cv::addWeighted(aOverlay, aAlpha, theBlock.where, 1.0 - aAlpha, 0.0, theBlock.where);

		} else {
			cv::rectangle(theBlock.where, theContent, cv::Scalar(0x31, 0x31, 0x31), CVUI_FILLED);
		}
	}